

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complexwidgets.cpp
# Opt level: O0

QAccessibleInterface * __thiscall
QAccessibleAbstractScrollArea::child(QAccessibleAbstractScrollArea *this,int index)

{
  const_reference ppQVar1;
  QAccessibleInterface *pQVar2;
  long in_FS_OFFSET;
  QAccessibleAbstractScrollArea *in_stack_00000008;
  qsizetype in_stack_ffffffffffffffb8;
  QList<QWidget_*> *this_00;
  QList<QWidget_*> local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &local_20;
  accessibleChildren(in_stack_00000008);
  ppQVar1 = QList<QWidget_*>::at(this_00,in_stack_ffffffffffffffb8);
  pQVar2 = (QAccessibleInterface *)QAccessible::queryAccessibleInterface(&(*ppQVar1)->super_QObject)
  ;
  QList<QWidget_*>::~QList((QList<QWidget_*> *)0x7d5889);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return pQVar2;
  }
  __stack_chk_fail();
}

Assistant:

QAccessibleInterface *QAccessibleAbstractScrollArea::child(int index) const
{
    return QAccessible::queryAccessibleInterface(accessibleChildren().at(index));
}